

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O3

void INTERACTIONS::sort_and_filter_duplicate_interactions
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *vec,bool filter_duplicates,size_t *removed_cnt,size_t *sorted_cnt)

{
  undefined1 *puVar1;
  char cVar2;
  pointer pcVar3;
  pointer ppVar4;
  undefined1 *puVar5;
  bool bVar6;
  pointer pbVar7;
  char *pcVar8;
  long lVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *extraout_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *extraout_RDX_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *extraout_RDX_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *extraout_RDX_02;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  _Var10;
  ulong uVar11;
  long lVar12;
  char cVar13;
  undefined7 in_register_00000031;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *i;
  iterator __last;
  pointer ppVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  _Var16;
  ulong uVar17;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar18;
  iterator __first;
  bool bVar19;
  bool bVar20;
  pair<char_*,_long> pVar21;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  vec_sorted;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string sorted_i;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_98;
  uint local_6c;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  size_t *local_48;
  size_t *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  uVar17 = CONCAT71(in_register_00000031,filter_duplicates);
  *removed_cnt = 0;
  *sorted_cnt = 0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        *)0x0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        *)0x0;
  pbVar7 = (vec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_48 = removed_cnt;
  local_40 = sorted_cnt;
  if ((vec->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    local_6c = (uint)uVar17;
    lVar12 = 8;
    uVar17 = 0;
    local_38 = vec;
    do {
      local_68 = local_58;
      lVar9 = *(long *)((long)pbVar7 + lVar12 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,lVar9,
                 *(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar12) + lVar9);
      puVar5 = local_68;
      if (local_60 == 0) {
        lVar9 = 0;
      }
      else {
        puVar1 = local_68 + local_60;
        pVar21 = std::get_temporary_buffer<char>((local_60 - (local_60 + 1 >> 0x3f)) + 1 >> 1);
        pcVar8 = pVar21.first;
        if (pcVar8 == (char *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar5,puVar1);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar5,puVar1,pcVar8,pVar21.second);
        }
        operator_delete(pcVar8);
        lVar9 = local_60;
      }
      paVar15 = &local_98.first.field_2;
      local_98.first._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_68,local_68 + lVar9);
      local_98.second = uVar17;
      std::
      vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
      ::emplace_back<std::pair<std::__cxx11::string,unsigned_long>>
                ((vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
                  *)&local_b8,&local_98);
      vec = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.first._M_dataplus._M_p != paVar15) {
        operator_delete(local_98.first._M_dataplus._M_p);
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      uVar17 = uVar17 + 1;
      pbVar7 = (vec->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x20;
    } while (uVar17 < (ulong)((long)(vec->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)
            );
    uVar17 = (ulong)local_6c;
  }
  ppVar14 = local_b8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = local_b8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((char)uVar17 != '\0') {
    __last._M_current =
         local_b8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __first._M_current =
         local_b8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (local_b8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar12 = ((long)local_b8.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                           *)&local_98,
                          (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                           )local_b8.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (lVar12 - (lVar12 + 1 >> 0x3f)) + 1 >> 1);
      if (local_98.first.field_2._M_allocated_capacity == 0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::__0>>
                  (ppVar4,ppVar14);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,std::pair<std::__cxx11::string,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::__0>>
                  (ppVar4,ppVar14,local_98.first.field_2._M_allocated_capacity,
                   local_98.first._M_string_length);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                  *)&local_98);
      __last._M_current =
           local_b8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      _Var10._M_current = extraout_RDX;
      _Var16._M_current =
           local_b8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __first._M_current = __last._M_current;
      if (local_b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          this = _Var16._M_current;
          _Var16._M_current = this + 1;
          if (_Var16._M_current == __last._M_current) goto LAB_00214778;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::$_1>
                  ::operator()(this,_Var16,_Var10);
          _Var10._M_current = extraout_RDX_00;
        } while (!bVar6);
        _Var16._M_current = this + 2;
        ppVar18 = __last._M_current;
        for (; _Var16._M_current != __last._M_current; _Var16._M_current = _Var16._M_current + 1) {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::$_1>
                  ::operator()(this,_Var16,_Var10);
          _Var10._M_current = extraout_RDX_01;
          ppVar18 = this;
          if (!bVar6) {
            ppVar18 = this + 1;
            std::__cxx11::string::operator=((string *)ppVar18,(string *)_Var16._M_current);
            this[1].second = (_Var16._M_current)->second;
            _Var10._M_current = extraout_RDX_02;
          }
          this = ppVar18;
          ppVar18 = local_b8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        __last._M_current = ppVar18;
        __first._M_current = this + 1;
      }
    }
LAB_00214778:
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::_M_erase(&local_b8,__first,__last);
    ppVar14 = local_b8.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = local_b8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)local_b8.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    lVar9 = lVar12 * -0x3333333333333333;
    *local_48 = ((long)(vec->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(vec->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) +
                lVar12 * 0x3333333333333333;
    if (local_b8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_b8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                           *)&local_98,
                          (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                           )local_b8.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (lVar9 - (lVar9 + 1 >> 0x3f)) + 1 >> 1);
      if (local_98.first.field_2._M_allocated_capacity == 0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::__2>>
                  (ppVar4,ppVar14);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,std::pair<std::__cxx11::string,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::__2>>
                  (ppVar4,ppVar14,local_98.first.field_2._M_allocated_capacity,
                   local_98.first._M_string_length);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                  *)&local_98);
    }
  }
  ppVar4 = local_b8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.first._M_dataplus._M_p = (pointer)0x0;
  local_98.first._M_string_length = 0;
  local_98.first.field_2._M_allocated_capacity = 0;
  if (local_b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar14 = local_b8.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar17 = (ppVar14->first)._M_string_length;
      if (uVar17 < 2) {
LAB_0021483b:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_98,&ppVar14->first);
        *local_40 = *local_40 + 1;
      }
      else {
        pcVar3 = (ppVar14->first)._M_dataplus._M_p;
        if (pcVar3 != pcVar3 + (uVar17 - 1)) {
          uVar11 = 1;
          bVar20 = false;
          cVar13 = *pcVar3;
          bVar6 = false;
          do {
            cVar2 = pcVar3[uVar11];
            bVar19 = cVar13 == cVar2;
            if (bVar19) {
              if (bVar6) goto LAB_0021483b;
            }
            else if (bVar20) goto LAB_0021483b;
            bVar20 = cVar13 == cVar2;
            uVar11 = uVar11 + 1;
            cVar13 = cVar2;
            bVar6 = !bVar19;
          } while (uVar17 != uVar11);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_98,
                    (vec->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + ppVar14->second);
      }
      ppVar14 = ppVar14 + 1;
    } while (ppVar14 != ppVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(vec,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_98);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void sort_and_filter_duplicate_interactions(
    std::vector<std::string>& vec, bool filter_duplicates, size_t& removed_cnt, size_t& sorted_cnt)
{
  // 2 out parameters
  removed_cnt = 0;
  sorted_cnt = 0;

  // interaction value sort + original position
  std::vector<std::pair<std::string, size_t>> vec_sorted;
  for (size_t i = 0; i < vec.size(); ++i)
  {
    std::string sorted_i(vec[i]);
    std::stable_sort(std::begin(sorted_i), std::end(sorted_i));
    vec_sorted.push_back(make_pair(sorted_i, i));
  }

  if (filter_duplicates)
  {
    // remove duplicates
    std::stable_sort(vec_sorted.begin(), vec_sorted.end(),
        [](std::pair<std::string, size_t> const& a, std::pair<std::string, size_t> const& b) {
          return a.first < b.first;
        });
    auto last = unique(vec_sorted.begin(), vec_sorted.end(),
        [](std::pair<std::string, size_t> const& a, std::pair<std::string, size_t> const& b) {
          return a.first == b.first;
        });
    vec_sorted.erase(last, vec_sorted.end());

    // report number of removed interactions
    removed_cnt = vec.size() - vec_sorted.size();

    // restore original order
    std::stable_sort(vec_sorted.begin(), vec_sorted.end(),
        [](std::pair<std::string, size_t> const& a, std::pair<std::string, size_t> const& b) {
          return a.second < b.second;
        });
  }

  // we have original vector and vector with duplicates removed + corresponding indexes in original vector
  // plus second vector's data is sorted. We can reuse it if we need interaction to be left sorted.
  // let's make a new vector from these two sources - without dulicates and with sorted data whenever it's needed.
  std::vector<std::string> res;
  for (auto& i : vec_sorted)
  {
    if (must_be_left_sorted(i.first))
    {
      // if so - copy sorted data to result
      res.push_back(i.first);
      ++sorted_cnt;
    }
    else  // else - move unsorted data to result
      res.push_back(vec[i.second]);
  }

  vec = res;
}